

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O2

void * build_pcp_msg(pcp_flow_t *flow)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uint8_t uVar6;
  pcp_server_t *ppVar7;
  uint8_t *puVar8;
  ulong __n;
  byte bVar9;
  pcp_map_v1_t *map_info;
  uint8_t *puVar10;
  long lStack_30;
  
  if ((flow == (pcp_flow_t *)0x0) ||
     (ppVar7 = get_pcp_server(flow->ctx,flow->pcp_server_indx), ppVar7 == (pcp_server_t *)0x0)) {
    return (void *)0x0;
  }
  puVar8 = (uint8_t *)flow->pcp_msg_buffer;
  if (puVar8 == (uint8_t *)0x0) {
    puVar8 = (uint8_t *)calloc(1,0x44c);
    flow->pcp_msg_buffer = (char *)puVar8;
    if (puVar8 == (uint8_t *)0x0) {
      pcp_logger(PCP_LOGLVL_ERR,"%s","Malloc can\'t allocate enough memory for the pcp_flow.");
      return (void *)0x0;
    }
  }
  if (ppVar7->pcp_version == '\0') {
    uVar6 = (flow->kd).operation;
    if (uVar6 == '\x01') {
      uVar6 = (flow->kd).field_5.map_peer.protocol;
      if (uVar6 == '\x06') {
        uVar6 = '\x02';
      }
      else {
        if (uVar6 != '\x11') {
          return puVar8;
        }
        uVar6 = '\x01';
      }
      puVar8[1] = uVar6;
      *puVar8 = '\0';
      uVar1 = flow->lifetime;
      *(uint *)(puVar8 + 8) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      *(uint16_t *)(puVar8 + 4) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar8 + 6) = (flow->field_5).map_peer.ext_port;
      uVar2 = 0xc;
    }
    else {
      if (uVar6 != '\0') {
        return puVar8;
      }
      puVar8[0] = '\0';
      puVar8[1] = '\0';
      uVar2 = 2;
    }
    flow->pcp_msg_len = uVar2;
    return puVar8;
  }
  *puVar8 = ppVar7->pcp_version;
  puVar8[1] = puVar8[1] | (flow->kd).operation & 0x7f;
  uVar1 = flow->lifetime;
  *(uint *)(puVar8 + 4) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar2 = (flow->kd).src_ip.__in6_u.__u6_addr32[1];
  uVar3 = (flow->kd).src_ip.__in6_u.__u6_addr32[2];
  uVar4 = (flow->kd).src_ip.__in6_u.__u6_addr32[3];
  *(uint32_t *)(puVar8 + 8) = (flow->kd).src_ip.__in6_u.__u6_addr32[0];
  *(uint32_t *)(puVar8 + 0xc) = uVar2;
  *(uint32_t *)(puVar8 + 0x10) = uVar3;
  *(uint32_t *)(puVar8 + 0x14) = uVar4;
  flow->pcp_msg_len = 0x18;
  bVar9 = (flow->kd).operation;
  if (3 < bVar9) {
LAB_001058c7:
    pcp_logger(PCP_LOGLVL_ERR,"%s","Unsupported operation.");
    free(flow->pcp_msg_buffer);
    flow->pcp_msg_buffer = (char *)0x0;
    flow->pcp_msg_len = 0;
    return (void *)0x0;
  }
  puVar10 = puVar8 + 0x18;
  switch(bVar9) {
  case 0:
    goto switchD_0010578a_caseD_0;
  case 1:
    if (ppVar7->pcp_version == '\x02') {
      puVar8[0x24] = (flow->kd).field_5.map_peer.protocol;
      *(uint16_t *)(puVar8 + 0x28) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar8 + 0x2a) = (flow->field_5).map_peer.ext_port;
      uVar5 = *(undefined8 *)((long)&flow->field_5 + 8);
      *(undefined8 *)(puVar8 + 0x2c) = *(undefined8 *)&flow->field_5;
      *(undefined8 *)(puVar8 + 0x34) = uVar5;
      *(uint32_t *)(puVar8 + 0x20) = (flow->kd).nonce.n[2];
      *(undefined8 *)puVar10 = *(undefined8 *)(flow->kd).nonce.n;
      lStack_30 = 0x24;
    }
    else {
      if (ppVar7->pcp_version != '\x01') goto LAB_001058c7;
      puVar8[0x18] = (flow->kd).field_5.map_peer.protocol;
      *(uint16_t *)(puVar8 + 0x1c) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar8 + 0x1e) = (flow->field_5).map_peer.ext_port;
      uVar5 = *(undefined8 *)((long)&flow->field_5 + 8);
      *(undefined8 *)(puVar8 + 0x20) = *(undefined8 *)&flow->field_5;
      *(undefined8 *)(puVar8 + 0x28) = uVar5;
      lStack_30 = 0x18;
    }
    break;
  case 2:
    if (ppVar7->pcp_version == '\x02') {
      puVar8[0x24] = (flow->kd).field_5.map_peer.protocol;
      *(uint16_t *)(puVar8 + 0x28) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar8 + 0x2a) = (flow->field_5).map_peer.ext_port;
      *(uint16_t *)(puVar8 + 0x3c) = (flow->kd).field_5.map_peer.dst_port;
      uVar5 = *(undefined8 *)((long)&flow->field_5 + 8);
      *(undefined8 *)(puVar8 + 0x2c) = *(undefined8 *)&flow->field_5;
      *(undefined8 *)(puVar8 + 0x34) = uVar5;
      uVar5 = *(undefined8 *)((long)&(flow->kd).field_5 + 0xc);
      *(undefined8 *)(puVar8 + 0x40) = *(undefined8 *)((long)&(flow->kd).field_5 + 4);
      *(undefined8 *)(puVar8 + 0x48) = uVar5;
      *(undefined8 *)puVar10 = *(undefined8 *)(flow->kd).nonce.n;
      *(uint32_t *)(puVar8 + 0x20) = (flow->kd).nonce.n[2];
      lStack_30 = 0x38;
    }
    else {
      if (ppVar7->pcp_version != '\x01') goto LAB_001058c7;
      puVar8[0x18] = (flow->kd).field_5.map_peer.protocol;
      *(uint16_t *)(puVar8 + 0x1c) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar8 + 0x1e) = (flow->field_5).map_peer.ext_port;
      *(uint16_t *)(puVar8 + 0x30) = (flow->kd).field_5.map_peer.dst_port;
      uVar5 = *(undefined8 *)((long)&flow->field_5 + 8);
      *(undefined8 *)(puVar8 + 0x20) = *(undefined8 *)&flow->field_5;
      *(undefined8 *)(puVar8 + 0x28) = uVar5;
      uVar5 = *(undefined8 *)((long)&(flow->kd).field_5 + 0xc);
      *(undefined8 *)(puVar8 + 0x34) = *(undefined8 *)((long)&(flow->kd).field_5 + 4);
      *(undefined8 *)(puVar8 + 0x3c) = uVar5;
      lStack_30 = 0x2c;
    }
    break;
  case 3:
    if (ppVar7->pcp_version != '\x02') goto LAB_001058c7;
    *(uint32_t *)(puVar8 + 0x20) = (flow->kd).nonce.n[2];
    *(undefined8 *)puVar10 = *(undefined8 *)(flow->kd).nonce.n;
    puVar8[0x24] = (flow->field_5).sadscp.toler_fields;
    bVar9 = (flow->field_5).sadscp.app_name_length;
    bVar9 = ((bVar9 ^ 1) + 1 & 3) + bVar9;
    puVar8[0x25] = bVar9;
    puVar10 = puVar8 + 0x26;
    __n = (ulong)(flow->field_5).sadscp.app_name_length;
    if (flow->sadscp_app_name == (char *)0x0) {
      memset(puVar10,0,__n);
    }
    else {
      memcpy(puVar10,flow->sadscp_app_name,__n);
    }
    puVar10 = puVar10 + bVar9;
    goto LAB_001059e7;
  }
  puVar10 = puVar10 + lStack_30;
LAB_001059e7:
  build_pcp_options(flow,puVar10);
switchD_0010578a_caseD_0:
  return puVar8;
}

Assistant:

void *build_pcp_msg(pcp_flow_t *flow) {
    ssize_t ret = -1;
    pcp_server_t *pcp_server = NULL;
    pcp_request_t *req;
    // pointer used for referencing next data structure in linked list
    void *next_data = NULL;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!flow) {
        return NULL;
    }

    pcp_server = get_pcp_server(flow->ctx, flow->pcp_server_indx);

    if (!pcp_server) {
        return NULL;
    }

    if (!flow->pcp_msg_buffer) {
        flow->pcp_msg_buffer = (char *)calloc(1, PCP_MAX_LEN);
        if (flow->pcp_msg_buffer == NULL) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Malloc can't allocate enough memory for the pcp_flow.");
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return NULL;
        }
    }

    req = (pcp_request_t *)flow->pcp_msg_buffer;

    if (pcp_server->pcp_version == 0) {
        // NATPMP
#ifndef PCP_DISABLE_NATPMP
        ret = build_natpmp_msg(flow);
#endif
    } else {

        req->ver = pcp_server->pcp_version;

        req->r_opcode |= (uint8_t)(flow->kd.operation & 0x7f); // set  opcode
        req->req_lifetime = htonl((uint32_t)flow->lifetime);

        memcpy(&req->ip, &flow->kd.src_ip, 16);
        // next data in the packet
        next_data = req->next_data;
        flow->pcp_msg_len = (uint8_t *)next_data - (uint8_t *)req;

        switch (flow->kd.operation) {
        case PCP_OPCODE_PEER:
            ret = build_pcp_peer(pcp_server, flow, next_data);
            break;
        case PCP_OPCODE_MAP:
            ret = build_pcp_map(pcp_server, flow, next_data);
            break;
#ifdef PCP_SADSCP
        case PCP_OPCODE_SADSCP:
            ret = build_pcp_sadscp(pcp_server, flow, next_data);
            break;
#endif
        case PCP_OPCODE_ANNOUNCE:
            ret = 0;
            break;
        }
    }

    if (ret < 0) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s", "Unsupported operation.");
        free(flow->pcp_msg_buffer);
        flow->pcp_msg_buffer = NULL;
        flow->pcp_msg_len = 0;
        req = NULL;
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return req;
}